

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

int codebook_decode_scalar_raw(vorb *f,Codebook *c)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long in_RSI;
  vorb *in_RDI;
  int m;
  int len;
  int n;
  int x;
  uint32 code;
  int i;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_28;
  int local_24;
  int local_1c;
  
  prep_huffman((vorb *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if ((*(long *)(in_RSI + 0x28) == 0) && (*(long *)(in_RSI + 0x830) == 0)) {
    return -1;
  }
  if (*(int *)(in_RSI + 4) < 9) {
    if (*(long *)(in_RSI + 0x28) == 0) goto LAB_00243e7f;
  }
  else if (*(long *)(in_RSI + 0x830) != 0) {
LAB_00243e7f:
    uVar3 = bit_reverse(in_RDI->acc);
    local_24 = 0;
    iVar2 = *(int *)(in_RSI + 0x840);
    while (local_28 = iVar2, 1 < local_28) {
      iVar4 = local_28 >> 1;
      iVar2 = iVar4;
      if (*(uint *)(*(long *)(in_RSI + 0x830) + (long)(local_24 + iVar4) * 4) <= uVar3) {
        iVar2 = local_28 - iVar4;
        local_24 = local_24 + iVar4;
      }
    }
    if (*(char *)(in_RSI + 0x1b) == '\0') {
      local_24 = *(int *)(*(long *)(in_RSI + 0x838) + (long)local_24 * 4);
    }
    bVar1 = *(byte *)(*(long *)(in_RSI + 8) + (long)local_24);
    if ((int)(uint)bVar1 <= in_RDI->valid_bits) {
      in_RDI->acc = in_RDI->acc >> (bVar1 & 0x1f);
      in_RDI->valid_bits = in_RDI->valid_bits - (uint)bVar1;
      return local_24;
    }
    in_RDI->valid_bits = 0;
    return -1;
  }
  local_1c = 0;
  while( true ) {
    if (*(int *)(in_RSI + 4) <= local_1c) {
      error(in_RDI,VORBIS_invalid_stream);
      in_RDI->valid_bits = 0;
      return -1;
    }
    if ((*(char *)(*(long *)(in_RSI + 8) + (long)local_1c) != -1) &&
       (*(uint *)(*(long *)(in_RSI + 0x28) + (long)local_1c * 4) ==
        (in_RDI->acc & (1 << (*(byte *)(*(long *)(in_RSI + 8) + (long)local_1c) & 0x1f)) - 1U)))
    break;
    local_1c = local_1c + 1;
  }
  if ((int)(uint)*(byte *)(*(long *)(in_RSI + 8) + (long)local_1c) <= in_RDI->valid_bits) {
    in_RDI->acc = in_RDI->acc >> (*(byte *)(*(long *)(in_RSI + 8) + (long)local_1c) & 0x1f);
    in_RDI->valid_bits =
         in_RDI->valid_bits - (uint)*(byte *)(*(long *)(in_RSI + 8) + (long)local_1c);
    return local_1c;
  }
  in_RDI->valid_bits = 0;
  return -1;
}

Assistant:

static int codebook_decode_scalar_raw(vorb *f, Codebook *c)
{
   int i;
   prep_huffman(f);

   if (c->codewords == NULL && c->sorted_codewords == NULL)
      return -1;

   // cases to use binary search: sorted_codewords && !c->codewords
   //                             sorted_codewords && c->entries > 8
   if (c->entries > 8 ? c->sorted_codewords!=NULL : !c->codewords) {
      // binary search
      uint32 code = bit_reverse(f->acc);
      int x=0, n=c->sorted_entries, len;

      while (n > 1) {
         // invariant: sc[x] <= code < sc[x+n]
         int m = x + (n >> 1);
         if (c->sorted_codewords[m] <= code) {
            x = m;
            n -= (n>>1);
         } else {
            n >>= 1;
         }
      }
      // x is now the sorted index
      if (!c->sparse) x = c->sorted_values[x];
      // x is now sorted index if sparse, or symbol otherwise
      len = c->codeword_lengths[x];
      if (f->valid_bits >= len) {
         f->acc >>= len;
         f->valid_bits -= len;
         return x;
      }

      f->valid_bits = 0;
      return -1;
   }

   // if small, linear search
   assert(!c->sparse);
   for (i=0; i < c->entries; ++i) {
      if (c->codeword_lengths[i] == NO_CODE) continue;
      if (c->codewords[i] == (f->acc & ((1 << c->codeword_lengths[i])-1))) {
         if (f->valid_bits >= c->codeword_lengths[i]) {
            f->acc >>= c->codeword_lengths[i];
            f->valid_bits -= c->codeword_lengths[i];
            return i;
         }
         f->valid_bits = 0;
         return -1;
      }
   }

   error(f, VORBIS_invalid_stream);
   f->valid_bits = 0;
   return -1;
}